

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O3

exr_result_t
fasthuf_decode(exr_const_context_t pctxt,FastHufDecoder *fhd,uint8_t *src,uint64_t numSrcBits,
              uint16_t *dst,uint64_t numDstElems)

{
  uint16_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  byte bVar19;
  ulong *puVar20;
  char *pcVar21;
  exr_result_t eVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  uint32_t *puVar31;
  ulong uVar32;
  ulong *puVar33;
  uint64_t x_1;
  ulong uVar34;
  undefined1 in_XMM0 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  int iVar42;
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar57;
  undefined1 auVar55 [16];
  int iVar58;
  undefined1 auVar56 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  long lVar44;
  
  auVar17 = _DAT_001350e0;
  auVar16 = _DAT_001350c0;
  auVar15 = _DAT_001350b0;
  auVar14 = _DAT_001350a0;
  uVar18 = numSrcBits - 0x80;
  if (numDstElems != 0) {
    uVar3 = fhd->_tableMin;
    uVar2 = fhd->_rleSymbol;
    uVar32 = *(ulong *)src;
    uVar34 = *(ulong *)(src + 8);
    uVar24 = uVar34 >> 0x38 | (uVar34 & 0xff000000000000) >> 0x28 |
             (uVar34 & 0xff0000000000) >> 0x18 | (uVar34 & 0xff00000000) >> 8 |
             (uVar34 & 0xff000000) << 8 | (uVar34 & 0xff0000) << 0x18 | (uVar34 & 0xff00) << 0x28 |
             uVar34 << 0x38;
    uVar34 = uVar32 >> 0x38 | (uVar32 & 0xff000000000000) >> 0x28 |
             (uVar32 & 0xff0000000000) >> 0x18 | (uVar32 & 0xff00000000) >> 8 |
             (uVar32 & 0xff000000) << 8 | (uVar32 & 0xff0000) << 0x18 | (uVar32 & 0xff00) << 0x28 |
             uVar32 << 0x38;
    puVar20 = (ulong *)(src + 0x10);
    uVar26 = 0x40;
    uVar28 = 0x40;
    uVar32 = 0;
    do {
      if (uVar34 < uVar3) {
        uVar29 = uVar34;
        uVar27 = uVar26;
        if (uVar26 < 0x40) {
          do {
            uVar34 = uVar24;
            if (0 < (int)uVar26) {
              iVar25 = 0x40 - uVar26;
              uVar34 = uVar29 | uVar24 >> ((byte)uVar26 & 0x3f);
              if (iVar25 <= (int)uVar28) {
                uVar24 = uVar24 << ((byte)iVar25 & 0x3f);
                uVar28 = uVar28 - iVar25;
                uVar27 = 0x40;
                break;
              }
              uVar28 = uVar26 + uVar28;
            }
            uVar26 = uVar28;
            if (uVar18 < 0x40) {
              if (uVar18 < 8) {
                bVar19 = 0x38;
                uVar24 = 0;
              }
              else {
                uVar29 = uVar18 - 8;
                lVar23 = 0x38;
                uVar24 = 0;
                puVar33 = puVar20;
                do {
                  uVar24 = uVar24 | (ulong)(byte)*puVar33 << ((byte)lVar23 & 0x3f);
                  puVar33 = (ulong *)((long)puVar33 + 1);
                  lVar44 = uVar18 + lVar23;
                  lVar23 = lVar23 + -8;
                } while (7 < lVar44 - 0x40U);
                bVar19 = 0x30 - ((byte)uVar29 & 0xf8);
                uVar18 = (ulong)((uint)uVar18 & 7);
                puVar20 = (ulong *)((long)puVar20 + (uVar29 >> 3) + 1);
              }
              if (uVar18 != 0) {
                uVar24 = uVar24 | (ulong)(byte)*puVar20 << (bVar19 & 0x3f);
                puVar20 = (ulong *)((long)puVar20 + 1);
              }
              uVar18 = 0;
            }
            else {
              uVar24 = *puVar20;
              uVar24 = uVar24 >> 0x38 | (uVar24 & 0xff000000000000) >> 0x28 |
                       (uVar24 & 0xff0000000000) >> 0x18 | (uVar24 & 0xff00000000) >> 8 |
                       (uVar24 & 0xff000000) << 8 | (uVar24 & 0xff0000) << 0x18 |
                       (uVar24 & 0xff00) << 0x28 | uVar24 << 0x38;
              puVar20 = puVar20 + 1;
              uVar18 = uVar18 - 0x40;
            }
            uVar28 = 0x40;
            uVar29 = uVar34;
            uVar27 = 0x40;
          } while ((int)uVar26 < 0x40);
        }
        uVar26 = uVar27;
        lVar23 = -0x34;
        do {
          lVar44 = lVar23;
          lVar23 = lVar44 + 1;
        } while (uVar34 < fhd->_ljOffset[lVar44 + 5]);
        uVar29 = lVar44 + 0x41;
        if ((fhd->_maxCodeLength < uVar29) ||
           (uVar30 = (uVar34 >> (-(char)(lVar44 + 1) & 0x3fU)) +
                     *(long *)(fhd->_tableSymbol + lVar44 * 2 + 0xc), fhd->_numSymbols <= uVar30)) {
          if (pctxt != (exr_const_context_t)0x0) {
            pcVar21 = "Huffman decode error (Decoded an invalid symbol)";
            goto LAB_00114eba;
          }
          goto LAB_00114ef2;
        }
        puVar31 = fhd->_idToSymbol + uVar30;
      }
      else {
        uVar29 = (ulong)fhd->_tableCodeLen[uVar34 >> 0x34];
        puVar31 = (uint32_t *)(fhd->_tableSymbol + (uVar34 >> 0x34));
      }
      uVar34 = uVar34 << ((byte)uVar29 & 0x3f);
      uVar26 = uVar26 - (int)uVar29;
      if (*puVar31 == uVar2) {
        uVar29 = uVar34;
        uVar27 = uVar26;
        if ((int)uVar26 < 8) {
          do {
            uVar34 = uVar24;
            if (0 < (int)uVar26) {
              iVar25 = 0x40 - uVar26;
              uVar34 = uVar29 | uVar24 >> ((byte)uVar26 & 0x3f);
              if (iVar25 <= (int)uVar28) {
                uVar24 = uVar24 << ((byte)iVar25 & 0x3f);
                uVar28 = uVar28 - iVar25;
                uVar27 = 0x40;
                break;
              }
              uVar28 = uVar26 + uVar28;
            }
            uVar26 = uVar28;
            if (uVar18 < 0x40) {
              if (uVar18 < 8) {
                bVar19 = 0x38;
                uVar24 = 0;
              }
              else {
                uVar29 = uVar18 - 8;
                lVar23 = 0x38;
                uVar24 = 0;
                puVar33 = puVar20;
                do {
                  uVar24 = uVar24 | (ulong)(byte)*puVar33 << ((byte)lVar23 & 0x3f);
                  puVar33 = (ulong *)((long)puVar33 + 1);
                  lVar44 = uVar18 + lVar23;
                  lVar23 = lVar23 + -8;
                } while (7 < lVar44 - 0x40U);
                bVar19 = 0x30 - ((byte)uVar29 & 0xf8);
                uVar18 = (ulong)((uint)uVar18 & 7);
                puVar20 = (ulong *)((long)puVar20 + (uVar29 >> 3) + 1);
              }
              if (uVar18 != 0) {
                uVar24 = uVar24 | (ulong)(byte)*puVar20 << (bVar19 & 0x3f);
                puVar20 = (ulong *)((long)puVar20 + 1);
              }
              uVar18 = 0;
            }
            else {
              uVar24 = *puVar20;
              uVar24 = uVar24 >> 0x38 | (uVar24 & 0xff000000000000) >> 0x28 |
                       (uVar24 & 0xff0000000000) >> 0x18 | (uVar24 & 0xff00000000) >> 8 |
                       (uVar24 & 0xff000000) << 8 | (uVar24 & 0xff0000) << 0x18 |
                       (uVar24 & 0xff00) << 0x28 | uVar24 << 0x38;
              puVar20 = puVar20 + 1;
              uVar18 = uVar18 - 0x40;
            }
            uVar28 = 0x40;
            uVar27 = 0x40;
            uVar29 = uVar34;
          } while ((int)uVar26 < 0x40);
        }
        if (uVar32 == 0) {
          if (pctxt != (exr_const_context_t)0x0) {
            pcVar21 = "Huffman decode error (RLE code with no previous symbol)";
LAB_00114eba:
            (*pctxt->print_error)(pctxt,0x17,pcVar21);
            return 0x17;
          }
          goto LAB_00114ef2;
        }
        uVar30 = uVar34 >> 0x38;
        uVar29 = uVar30 + uVar32;
        if (numDstElems < uVar29) {
          if (pctxt != (exr_const_context_t)0x0) {
            pcVar21 = "Huffman decode error (Symbol run beyond expected output buffer length)";
            goto LAB_00114eba;
          }
          goto LAB_00114ef2;
        }
        if (uVar30 == 0) {
          if (pctxt != (exr_const_context_t)0x0) {
            pcVar21 = "Huffman decode error (Invalid RLE length)";
            goto LAB_00114eba;
          }
          goto LAB_00114ef2;
        }
        uVar1 = dst[uVar32 - 1];
        lVar23 = uVar30 - 1;
        auVar41._8_4_ = (int)lVar23;
        auVar41._0_8_ = lVar23;
        auVar41._12_4_ = (int)((ulong)lVar23 >> 0x20);
        lVar23 = uVar32 * 2;
        auVar41 = auVar41 ^ auVar17;
        uVar32 = 0;
        auVar43 = auVar16;
        auVar45 = auVar15;
        auVar46 = auVar14;
        auVar47 = _DAT_00135090;
        do {
          auVar48 = auVar43 ^ auVar17;
          iVar25 = auVar41._0_4_;
          iVar54 = -(uint)(iVar25 < auVar48._0_4_);
          iVar40 = auVar41._4_4_;
          auVar49._4_4_ = -(uint)(iVar40 < auVar48._4_4_);
          iVar58 = auVar41._8_4_;
          iVar57 = -(uint)(iVar58 < auVar48._8_4_);
          iVar42 = auVar41._12_4_;
          auVar49._12_4_ = -(uint)(iVar42 < auVar48._12_4_);
          auVar35._4_4_ = iVar54;
          auVar35._0_4_ = iVar54;
          auVar35._8_4_ = iVar57;
          auVar35._12_4_ = iVar57;
          auVar59 = pshuflw(in_XMM15,auVar35,0xe8);
          auVar36._4_4_ = -(uint)(auVar48._4_4_ == iVar40);
          auVar36._12_4_ = -(uint)(auVar48._12_4_ == iVar42);
          auVar36._0_4_ = auVar36._4_4_;
          auVar36._8_4_ = auVar36._12_4_;
          auVar35 = pshuflw(in_XMM0,auVar36,0xe8);
          auVar49._0_4_ = auVar49._4_4_;
          auVar49._8_4_ = auVar49._12_4_;
          auVar60 = pshuflw(auVar59,auVar49,0xe8);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar60 | auVar35 & auVar59) ^ auVar48;
          auVar48 = packssdw(auVar48,auVar48);
          if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar32 + lVar23) = uVar1;
          }
          auVar60._4_4_ = iVar54;
          auVar60._0_4_ = iVar54;
          auVar60._8_4_ = iVar57;
          auVar60._12_4_ = iVar57;
          auVar49 = auVar36 & auVar60 | auVar49;
          auVar35 = packssdw(auVar49,auVar49);
          auVar59._8_4_ = 0xffffffff;
          auVar59._0_8_ = 0xffffffffffffffff;
          auVar59._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35 ^ auVar59,auVar35 ^ auVar59);
          if ((auVar35._0_4_ >> 0x10 & 1) != 0) {
            *(uint16_t *)((long)dst + uVar32 + lVar23 + 2) = uVar1;
          }
          auVar35 = auVar45 ^ auVar17;
          iVar54 = -(uint)(iVar25 < auVar35._0_4_);
          auVar55._4_4_ = -(uint)(iVar40 < auVar35._4_4_);
          iVar57 = -(uint)(iVar58 < auVar35._8_4_);
          auVar55._12_4_ = -(uint)(iVar42 < auVar35._12_4_);
          auVar50._4_4_ = iVar54;
          auVar50._0_4_ = iVar54;
          auVar50._8_4_ = iVar57;
          auVar50._12_4_ = iVar57;
          iVar54 = -(uint)(auVar35._4_4_ == iVar40);
          iVar57 = -(uint)(auVar35._12_4_ == iVar42);
          auVar8._4_4_ = iVar54;
          auVar8._0_4_ = iVar54;
          auVar8._8_4_ = iVar57;
          auVar8._12_4_ = iVar57;
          auVar55._0_4_ = auVar55._4_4_;
          auVar55._8_4_ = auVar55._12_4_;
          auVar35 = auVar8 & auVar50 | auVar55;
          auVar35 = packssdw(auVar35,auVar35);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar35 = packssdw(auVar35 ^ auVar4,auVar35 ^ auVar4);
          if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar32 + lVar23 + 4) = uVar1;
          }
          auVar35 = pshufhw(auVar35,auVar50,0x84);
          auVar9._4_4_ = iVar54;
          auVar9._0_4_ = iVar54;
          auVar9._8_4_ = iVar57;
          auVar9._12_4_ = iVar57;
          auVar49 = pshufhw(auVar50,auVar9,0x84);
          auVar36 = pshufhw(auVar35,auVar55,0x84);
          auVar37._8_4_ = 0xffffffff;
          auVar37._0_8_ = 0xffffffffffffffff;
          auVar37._12_4_ = 0xffffffff;
          auVar37 = (auVar36 | auVar49 & auVar35) ^ auVar37;
          auVar35 = packssdw(auVar37,auVar37);
          if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar32 + lVar23 + 6) = uVar1;
          }
          auVar35 = auVar46 ^ auVar17;
          iVar54 = -(uint)(iVar25 < auVar35._0_4_);
          auVar52._4_4_ = -(uint)(iVar40 < auVar35._4_4_);
          iVar57 = -(uint)(iVar58 < auVar35._8_4_);
          auVar52._12_4_ = -(uint)(iVar42 < auVar35._12_4_);
          auVar10._4_4_ = iVar54;
          auVar10._0_4_ = iVar54;
          auVar10._8_4_ = iVar57;
          auVar10._12_4_ = iVar57;
          auVar36 = pshuflw(auVar48,auVar10,0xe8);
          auVar38._0_4_ = -(uint)(auVar35._0_4_ == iVar25);
          auVar38._4_4_ = -(uint)(auVar35._4_4_ == iVar40);
          auVar38._8_4_ = -(uint)(auVar35._8_4_ == iVar58);
          auVar38._12_4_ = -(uint)(auVar35._12_4_ == iVar42);
          auVar51._4_4_ = auVar38._4_4_;
          auVar51._0_4_ = auVar38._4_4_;
          auVar51._8_4_ = auVar38._12_4_;
          auVar51._12_4_ = auVar38._12_4_;
          auVar48 = pshuflw(auVar38,auVar51,0xe8);
          auVar52._0_4_ = auVar52._4_4_;
          auVar52._8_4_ = auVar52._12_4_;
          auVar35 = pshuflw(auVar36,auVar52,0xe8);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          in_XMM15 = (auVar35 | auVar48 & auVar36) ^ auVar5;
          auVar48 = packssdw(auVar48 & auVar36,in_XMM15);
          if ((auVar48 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar32 + lVar23 + 8) = uVar1;
          }
          auVar11._4_4_ = iVar54;
          auVar11._0_4_ = iVar54;
          auVar11._8_4_ = iVar57;
          auVar11._12_4_ = iVar57;
          auVar52 = auVar51 & auVar11 | auVar52;
          auVar35 = packssdw(auVar52,auVar52);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar48 = packssdw(auVar48,auVar35 ^ auVar6);
          if ((auVar48 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar32 + lVar23 + 10) = uVar1;
          }
          auVar48 = auVar47 ^ auVar17;
          iVar25 = -(uint)(iVar25 < auVar48._0_4_);
          auVar56._4_4_ = -(uint)(iVar40 < auVar48._4_4_);
          iVar58 = -(uint)(iVar58 < auVar48._8_4_);
          auVar56._12_4_ = -(uint)(iVar42 < auVar48._12_4_);
          auVar53._4_4_ = iVar25;
          auVar53._0_4_ = iVar25;
          auVar53._8_4_ = iVar58;
          auVar53._12_4_ = iVar58;
          iVar25 = -(uint)(auVar48._4_4_ == iVar40);
          iVar40 = -(uint)(auVar48._12_4_ == iVar42);
          auVar12._4_4_ = iVar25;
          auVar12._0_4_ = iVar25;
          auVar12._8_4_ = iVar40;
          auVar12._12_4_ = iVar40;
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar48 = auVar12 & auVar53 | auVar56;
          auVar48 = packssdw(auVar48,auVar48);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar48 = packssdw(auVar48 ^ auVar7,auVar48 ^ auVar7);
          if ((auVar48 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar32 + lVar23 + 0xc) = uVar1;
          }
          auVar48 = pshufhw(auVar48,auVar53,0x84);
          auVar13._4_4_ = iVar25;
          auVar13._0_4_ = iVar25;
          auVar13._8_4_ = iVar40;
          auVar13._12_4_ = iVar40;
          auVar36 = pshufhw(auVar53,auVar13,0x84);
          auVar35 = pshufhw(auVar48,auVar56,0x84);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar39 = (auVar35 | auVar36 & auVar48) ^ auVar39;
          in_XMM0 = packssdw(auVar39,auVar39);
          if ((in_XMM0 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(uint16_t *)((long)dst + uVar32 + lVar23 + 0xe) = uVar1;
          }
          lVar44 = auVar43._8_8_;
          auVar43._0_8_ = auVar43._0_8_ + 8;
          auVar43._8_8_ = lVar44 + 8;
          lVar44 = auVar45._8_8_;
          auVar45._0_8_ = auVar45._0_8_ + 8;
          auVar45._8_8_ = lVar44 + 8;
          lVar44 = auVar46._8_8_;
          auVar46._0_8_ = auVar46._0_8_ + 8;
          auVar46._8_8_ = lVar44 + 8;
          lVar44 = auVar47._8_8_;
          auVar47._0_8_ = auVar47._0_8_ + 8;
          auVar47._8_8_ = lVar44 + 8;
          uVar32 = uVar32 + 0x10;
        } while (((uint)(byte)(uVar34 >> 0x38) * 2 + 0xe & 0xfffffff0) != uVar32);
        uVar34 = uVar34 << 8;
        uVar26 = uVar27 - 8;
      }
      else {
        dst[uVar32] = (uint16_t)*puVar31;
        uVar29 = uVar32 + 1;
      }
      uVar32 = uVar34;
      uVar27 = uVar26;
      if ((int)uVar26 < 0xc) {
        do {
          uVar34 = uVar24;
          if (0 < (int)uVar27) {
            iVar25 = 0x40 - uVar27;
            uVar34 = uVar32 | uVar24 >> ((byte)uVar27 & 0x3f);
            if (iVar25 <= (int)uVar28) {
              uVar24 = uVar24 << ((byte)iVar25 & 0x3f);
              uVar26 = 0x40;
              uVar28 = uVar28 - iVar25;
              break;
            }
            uVar28 = uVar27 + uVar28;
          }
          uVar27 = uVar28;
          if (uVar18 < 0x40) {
            if (uVar18 < 8) {
              bVar19 = 0x38;
              uVar24 = 0;
            }
            else {
              uVar32 = uVar18 - 8;
              lVar23 = 0x38;
              uVar24 = 0;
              puVar33 = puVar20;
              do {
                uVar24 = uVar24 | (ulong)(byte)*puVar33 << ((byte)lVar23 & 0x3f);
                puVar33 = (ulong *)((long)puVar33 + 1);
                lVar44 = uVar18 + lVar23;
                lVar23 = lVar23 + -8;
              } while (7 < lVar44 - 0x40U);
              bVar19 = 0x30 - ((byte)uVar32 & 0xf8);
              uVar18 = (ulong)((uint)uVar18 & 7);
              puVar20 = (ulong *)((long)puVar20 + (uVar32 >> 3) + 1);
            }
            if (uVar18 != 0) {
              uVar24 = uVar24 | (ulong)(byte)*puVar20 << (bVar19 & 0x3f);
              puVar20 = (ulong *)((long)puVar20 + 1);
            }
            uVar18 = 0;
          }
          else {
            uVar32 = *puVar20;
            uVar24 = uVar32 >> 0x38 | (uVar32 & 0xff000000000000) >> 0x28 |
                     (uVar32 & 0xff0000000000) >> 0x18 | (uVar32 & 0xff00000000) >> 8 |
                     (uVar32 & 0xff000000) << 8 | (uVar32 & 0xff0000) << 0x18 |
                     (uVar32 & 0xff00) << 0x28 | uVar32 << 0x38;
            puVar20 = puVar20 + 1;
            uVar18 = uVar18 - 0x40;
          }
          uVar28 = 0x40;
          uVar26 = 0x40;
          uVar32 = uVar34;
        } while ((int)uVar27 < 0x40);
      }
      uVar32 = uVar29;
    } while (uVar29 < numDstElems);
  }
  eVar22 = 0;
  if (uVar18 != 0) {
    if (pctxt == (exr_const_context_t)0x0) {
LAB_00114ef2:
      eVar22 = 0x17;
    }
    else {
      eVar22 = 0x17;
      (*pctxt->print_error)
                (pctxt,0x17,
                 "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)"
                 ,uVar18 & 0xffffffff);
    }
  }
  return eVar22;
}

Assistant:

static exr_result_t
fasthuf_decode (
    exr_const_context_t         pctxt,
    FastHufDecoder* NO_ALIAS    fhd,
    const uint8_t* NO_ALIAS     src,
    uint64_t                    numSrcBits,
    uint16_t* NO_ALIAS          dst,
    uint64_t                    numDstElems)
{
    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //
    uint64_t buffer, bufferBack, dstIdx, tMin;
    int      bufferNumBits, bufferBackNumBits;
    uint32_t rleSym;

    const uint8_t* NO_ALIAS currByte = src + 2 * sizeof (uint64_t);

    numSrcBits -= 8 * 2 * sizeof (uint64_t);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    buffer        = READ64 (src);
    bufferNumBits = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    bufferBack        = READ64 ((src + sizeof (uint64_t)));
    bufferBackNumBits = 64;
    dstIdx            = 0;

    tMin = fhd->_tableMin;
    rleSym = fhd->_rleSymbol;

    while (dstIdx < numDstElems)
    {
        int symbol, codeLen;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (tMin <= buffer)
        {
            int tableIdx = buffer >> INDEX_BIT_SHIFT;
            codeLen = fhd->_tableCodeLen[tableIdx];
            symbol  = fhd->_tableSymbol[tableIdx];
        }
        else
        {
            uint64_t id;

            if (bufferNumBits < 64)
            {
                FastHufDecoder_refill (
                    &buffer,
                    bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);
                bufferNumBits = 64;
            }

            //
            // Brute force search:
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            /* sentinel zero can never be greater than buffer */
            /* && codeLen <= _maxCodeLength */
            while (fhd->_ljBase[codeLen] > buffer)
                codeLen++;

            if (OUR_UNLIKELY(codeLen > fhd->_maxCodeLength))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            id = fhd->_ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (OUR_LIKELY(id < (uint64_t) fhd->_numSymbols))
            {
                symbol = fhd->_idToSymbol[id];
            }
            else
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we received a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == rleSym)
        {
            uint32_t rleCount;

            if (bufferNumBits < 8)
            {
                FastHufDecoder_refill (
                    &buffer,
                    bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);

                bufferNumBits = 64;
            }

            rleCount = buffer >> 56;

            if (OUR_UNLIKELY(dstIdx < 1))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (RLE code with no previous symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (OUR_UNLIKELY(dstIdx + (uint64_t) rleCount > numDstElems))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Symbol run beyond expected output buffer length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (OUR_UNLIKELY(rleCount == 0 || rleCount >= (uint32_t)INT32_MAX))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Invalid RLE length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            for (uint32_t i = 0; i < rleCount; ++i)
                dst[dstIdx + (uint64_t) i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = (uint16_t) symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of
        // bits needed for a table lookup
        //

        if (bufferNumBits < TABLE_LOOKUP_BITS)
        {
            FastHufDecoder_refill (
                &buffer,
                bufferNumBits,
                &bufferBack,
                &bufferBackNumBits,
                &currByte,
                &numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (OUR_UNLIKELY(numSrcBits != 0))
    {
        if (pctxt)
            pctxt->print_error (
                pctxt,
                EXR_ERR_CORRUPT_CHUNK,
                "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)",
                (int) numSrcBits);
        return EXR_ERR_CORRUPT_CHUNK;
    }

    return EXR_ERR_SUCCESS;
}